

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O2

void CoreML::KNNValidatorTests::addDataPoints(KNearestNeighborsClassifier *nnModel)

{
  NearestNeighborsIndex *pNVar1;
  Type *this;
  size_t j;
  long lVar2;
  size_t i;
  long lVar3;
  pointer pvVar4;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<std::vector<float,_std::allocator<float>_>_> __l_05;
  allocator_type local_161;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  points;
  vector<float,_std::allocator<float>_> point2b;
  vector<float,_std::allocator<float>_> point2;
  vector<float,_std::allocator<float>_> point1b;
  vector<float,_std::allocator<float>_> point1;
  vector<float,_std::allocator<float>_> point0b;
  vector<float,_std::allocator<float>_> point0;
  _Vector_base<float,_std::allocator<float>_> local_b8;
  vector<float,_std::allocator<float>_> local_a0;
  vector<float,_std::allocator<float>_> local_88;
  vector<float,_std::allocator<float>_> local_70;
  vector<float,_std::allocator<float>_> local_58;
  vector<float,_std::allocator<float>_> local_40;
  
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&point0,__l,(allocator_type *)&point0b);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3dcccccd00000000;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&point0b,__l_00,(allocator_type *)&point1);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&point1,__l_01,(allocator_type *)&point1b);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&point1b,__l_02,(allocator_type *)&point2);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x40066666;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&point2,__l_03,(allocator_type *)&point2b);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x40066666;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3dcccccd00000000;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector(&point2b,__l_04,(allocator_type *)&points);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_b8,&point0);
  std::vector<float,_std::allocator<float>_>::vector(&local_a0,&point1);
  std::vector<float,_std::allocator<float>_>::vector(&local_88,&point2);
  std::vector<float,_std::allocator<float>_>::vector(&local_70,&point0b);
  std::vector<float,_std::allocator<float>_>::vector(&local_58,&point1b);
  std::vector<float,_std::allocator<float>_>::vector(&local_40,&point2b);
  __l_05._M_len = 6;
  __l_05._M_array = (iterator)&local_b8;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&points,__l_05,&local_161);
  lVar3 = 0x78;
  do {
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)
               ((long)&local_b8._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  pNVar1 = Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(nnModel);
  pNVar1->numberofdimensions_ = 4;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::Add
              (&pNVar1->floatsamples_);
    pvVar4 = points.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar3;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      this = google::protobuf::internal::RepeatedPtrFieldBase::
             Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                       (&(pNVar1->floatsamples_).super_RepeatedPtrFieldBase,(int)lVar3);
      Specification::FloatVector::add_vector
                (this,(pvVar4->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar2]);
    }
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&points);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&point2b.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&point2.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&point1b.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&point1.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&point0b.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&point0.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void addDataPoints(Specification::KNearestNeighborsClassifier* nnModel) {

        std::vector<float> point0 = {0, 0, 0, 0};
        std::vector<float> point0b = {0, 0.1f, 0, 0};

        std::vector<float> point1 = {1, 0, 0, 0};
        std::vector<float> point1b = {1, 0, 0.1f, 0};

        std::vector<float> point2 = {2.1f, 0, 0, 0};
        std::vector<float> point2b = {2.1f, 0, 0, 0.1f};

        std::vector<std::vector<float>> points = {point0, point1, point2, point0b, point1b, point2b};
        size_t pointCount = 6;

        auto *nnIndex = nnModel->mutable_nearestneighborsindex();
        nnIndex->set_numberofdimensions(4);

        for (size_t i = 0; i < pointCount; i++) {
            nnIndex->add_floatsamples();
            const auto& sample = points[i];
            for (size_t j = 0; j < 4; j++) {
                nnIndex->mutable_floatsamples((int)i)->add_vector(sample[j]);
            }
        }

    }